

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void run_container_shift_tail(run_container_t *run,int32_t count,int32_t distance)

{
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int32_t dstpos;
  int32_t srcpos;
  
  if ((0 < in_EDX) && (in_RDI[1] < in_ESI + in_EDX)) {
    run_container_grow(run,count,distance._3_1_);
  }
  memmove((void *)(*(long *)(in_RDI + 2) + (long)((*in_RDI - in_ESI) + in_EDX) * 4),
          (void *)(*(long *)(in_RDI + 2) + (long)(*in_RDI - in_ESI) * 4),(long)in_ESI << 2);
  *in_RDI = in_EDX + *in_RDI;
  return;
}

Assistant:

static inline void run_container_shift_tail(run_container_t *run, int32_t count,
                                            int32_t distance) {
    if (distance > 0) {
        if (run->capacity < count + distance) {
            run_container_grow(run, count + distance, true);
        }
    }
    int32_t srcpos = run->n_runs - count;
    int32_t dstpos = srcpos + distance;
    memmove(&(run->runs[dstpos]), &(run->runs[srcpos]),
            sizeof(rle16_t) * count);
    run->n_runs += distance;
}